

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O2

void __thiscall
duckdb::PartialBlockManager::AllocateBlock
          (PartialBlockManager *this,PartialBlockState *state,uint32_t segment_size)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  idx_t val;
  block_id_t bVar3;
  
  if (this->partial_block_type == FULL_CHECKPOINT) {
    iVar1 = (*this->block_manager->_vptr_BlockManager[4])();
    bVar3 = CONCAT44(extraout_var,iVar1);
  }
  else {
    bVar3 = -1;
  }
  state->block_id = bVar3;
  val = BlockManager::GetBlockSize(this->block_manager);
  uVar2 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(val);
  state->block_size = uVar2;
  state->offset = 0;
  state->block_use_count = 1;
  return;
}

Assistant:

void PartialBlockManager::AllocateBlock(PartialBlockState &state, uint32_t segment_size) {
	D_ASSERT(segment_size <= block_manager.GetBlockSize());
	if (partial_block_type == PartialBlockType::FULL_CHECKPOINT) {
		state.block_id = block_manager.GetFreeBlockId();
	} else {
		state.block_id = INVALID_BLOCK;
	}
	state.block_size = NumericCast<uint32_t>(block_manager.GetBlockSize());
	state.offset = 0;
	state.block_use_count = 1;
}